

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile_identity_bases
                 (lysc_ctx *ctx,lysp_module *base_pmod,char **bases_p,lysc_ident *ident,
                 lysc_ident ***bases)

{
  lysc_ident *plVar1;
  lyd_node *plVar2;
  long lVar3;
  char **ppcVar4;
  int iVar5;
  LY_ERR LVar6;
  char *pcVar7;
  lys_module *plVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long *plVar11;
  lysc_ident **pplVar12;
  char *pcVar13;
  void *pvVar14;
  long lVar15;
  LY_VECODE code;
  lysc_ident *plVar16;
  void *pvVar17;
  ly_ctx *ctx_00;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  lysc_ident *plVar21;
  ly_set local_78;
  lysp_module *local_60;
  lysc_ident ***local_58;
  lysc_ctx *local_50;
  char **local_48;
  lyd_node *local_40;
  lysc_ident *local_38;
  
  local_58 = bases;
  if (ident == (lysc_ident *)0x0 && bases == (lysc_ident ***)0x0) {
    __assert_fail("ident || bases",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x14c,
                  "LY_ERR lys_compile_identity_bases(struct lysc_ctx *, const struct lysp_module *, const char **, struct lysc_ident *, struct lysc_ident ***)"
                 );
  }
  if (((bases_p == (char **)0x0) || (bases_p[-1] < (char *)0x2)) || (1 < ctx->pmod->version)) {
    pcVar18 = (char *)0x0;
    local_60 = base_pmod;
    local_48 = bases_p;
    while( true ) {
      ppcVar4 = local_48;
      if (local_48 == (char **)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        pcVar13 = local_48[-1];
      }
      if (pcVar13 <= pcVar18) {
        return LY_SUCCESS;
      }
      pcVar13 = local_48[(long)pcVar18];
      pcVar7 = strchr(pcVar13,0x3a);
      if (pcVar7 == (char *)0x0) {
        plVar8 = base_pmod->mod;
      }
      else {
        plVar8 = ly_resolve_prefix(ctx->ctx,pcVar13,(long)pcVar7 - (long)pcVar13,LY_VALUE_SCHEMA,
                                   base_pmod);
        pcVar13 = pcVar7 + 1;
      }
      if (plVar8 == (lys_module *)0x0) break;
      plVar16 = plVar8->identities;
      lVar20 = 0;
      uVar19 = 0;
      while( true ) {
        if (plVar16 == (lysc_ident *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(ulong *)&plVar16[-1].flags;
        }
        if (uVar9 <= uVar19) {
          ctx_00 = ctx->ctx;
          pcVar18 = local_48[(long)pcVar18];
          if (ident == (lysc_ident *)0x0) {
            pcVar13 = "Unable to find base (%s) of identityref.";
            goto LAB_00140d39;
          }
          pcVar13 = ident->name;
          pcVar7 = "Unable to find base (%s) of identity \"%s\".";
          goto LAB_00140d22;
        }
        iVar5 = strcmp(pcVar13,*(char **)((long)&plVar16->name + lVar20));
        if (iVar5 == 0) break;
        uVar19 = uVar19 + 1;
        lVar20 = lVar20 + 0x38;
      }
      if (ident == (lysc_ident *)0x0) {
        pplVar12 = *local_58;
        if (pplVar12 == (lysc_ident **)0x0) {
          plVar11 = (long *)malloc(0x10);
          if (plVar11 == (long *)0x0) goto LAB_00140df8;
          *plVar11 = 1;
          lVar15 = 1;
        }
        else {
          plVar16 = pplVar12[-1];
          pplVar12[-1] = (lysc_ident *)((long)&plVar16->name + 1);
          plVar11 = (long *)realloc(pplVar12 + -1,(long)plVar16 * 8 + 0x10);
          if (plVar11 == (long *)0x0) {
            pplVar12 = *local_58;
            goto LAB_00140df4;
          }
          lVar15 = *plVar11;
        }
        *local_58 = (lysc_ident **)(plVar11 + 1);
        plVar11[lVar15] = 0;
        plVar11[lVar15] = (long)&plVar8->identities->name + lVar20;
        base_pmod = local_60;
      }
      else {
        plVar1 = (lysc_ident *)((long)&plVar16->name + lVar20);
        if (plVar1 == ident) {
          ctx_00 = ctx->ctx;
          pcVar18 = ident->name;
          pcVar13 = "Identity \"%s\" is derived from itself.";
          code = LYVE_REFERENCE;
          goto LAB_00140d40;
        }
        pplVar12 = ident->derived;
        local_78.size = 0;
        local_78.count = 0;
        local_78.field_2.dnodes = (lyd_node **)0x0;
        local_50 = ctx;
        local_38 = ident;
        if (pplVar12 != (lysc_ident **)0x0) {
          if (pplVar12[-1] != (lysc_ident *)0x0) {
            plVar21 = (lysc_ident *)0x0;
            do {
              if (plVar1 == pplVar12[(long)plVar21]) {
LAB_00140d5f:
                ly_vlog(local_50->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Identity \"%s\" is indirectly derived from itself.",
                        *(undefined8 *)((long)&plVar16->name + lVar20));
                LVar6 = LY_EVALID;
LAB_00140d8b:
                ly_set_erase(&local_78,(_func_void_void_ptr *)0x0);
                return LVar6;
              }
              LVar6 = ly_set_add(&local_78,pplVar12[(long)plVar21],'\0',(uint32_t *)0x0);
              if (LVar6 != LY_SUCCESS) goto LAB_00140d8b;
              plVar21 = (lysc_ident *)((long)&plVar21->name + 1);
            } while (plVar21 < pplVar12[-1]);
            if (local_78.count != 0) {
              uVar19 = 0;
              do {
                local_40 = local_78.field_2.dnodes[uVar19];
                pvVar17 = (void *)0x0;
                while( true ) {
                  plVar2 = local_40->prev;
                  if (plVar2 == (lyd_node *)0x0) {
                    pvVar14 = (void *)0x0;
                  }
                  else {
                    pvVar14 = plVar2[-1].priv;
                  }
                  if (pvVar14 <= pvVar17) break;
                  if (plVar1 == *(lysc_ident **)(&plVar2->hash + (long)pvVar17 * 2))
                  goto LAB_00140d5f;
                  LVar6 = ly_set_add(&local_78,*(lysc_ident **)(&plVar2->hash + (long)pvVar17 * 2),
                                     '\0',(uint32_t *)0x0);
                  pvVar17 = (void *)((long)pvVar17 + 1);
                  if (LVar6 != LY_SUCCESS) goto LAB_00140d8b;
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < (ulong)local_78._0_8_ >> 0x20);
            }
          }
          ly_set_erase(&local_78,(_func_void_void_ptr *)0x0);
          plVar16 = plVar8->identities;
        }
        ident = local_38;
        ctx = local_50;
        base_pmod = local_60;
        lVar15 = *(long *)((long)&plVar16->derived + lVar20);
        if (lVar15 == 0) {
          puVar10 = (undefined8 *)malloc(0x10);
          if (puVar10 == (undefined8 *)0x0) goto LAB_00140df8;
          *puVar10 = 1;
        }
        else {
          lVar3 = *(long *)(lVar15 + -8);
          *(long *)(lVar15 + -8) = lVar3 + 1;
          puVar10 = (undefined8 *)realloc((void *)(lVar15 + -8),lVar3 * 8 + 0x10);
          plVar16 = plVar8->identities;
          if (puVar10 == (undefined8 *)0x0) {
            pplVar12 = *(lysc_ident ***)((long)&plVar16->derived + lVar20);
LAB_00140df4:
            pplVar12[-1] = (lysc_ident *)&pplVar12[-1][-1].field_0x37;
LAB_00140df8:
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_compile_identity_bases");
            return LY_EMEM;
          }
        }
        *(undefined8 **)((long)&plVar16->derived + lVar20) = puVar10 + 1;
        lVar20 = *(long *)((long)&plVar8->identities->derived + lVar20);
        *(lysc_ident **)(lVar20 + -8 + *(long *)(lVar20 + -8) * 8) = ident;
      }
      pcVar18 = pcVar18 + 1;
    }
    ctx_00 = ctx->ctx;
    pcVar18 = ppcVar4[(long)pcVar18];
    if (ident != (lysc_ident *)0x0) {
      pcVar13 = ident->name;
      pcVar7 = "Invalid prefix used for base (%s) of identity \"%s\".";
LAB_00140d22:
      ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_YANG,pcVar7,pcVar18,pcVar13);
      return LY_EVALID;
    }
    pcVar13 = "Invalid prefix used for base (%s) of identityref.";
  }
  else {
    ctx_00 = ctx->ctx;
    pcVar18 = "identityref type";
    if (ident != (lysc_ident *)0x0) {
      pcVar18 = "identity";
    }
    pcVar13 = "Multiple bases in %s are allowed only in YANG 1.1 modules.";
  }
LAB_00140d39:
  code = LYVE_SYNTAX_YANG;
LAB_00140d40:
  ly_vlog(ctx_00,(char *)0x0,code,pcVar13,pcVar18);
  return LY_EVALID;
}

Assistant:

LY_ERR
lys_compile_identity_bases(struct lysc_ctx *ctx, const struct lysp_module *base_pmod, const char **bases_p,
        struct lysc_ident *ident, struct lysc_ident ***bases)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const char *s, *name;
    const struct lys_module *mod;
    struct lysc_ident **idref;

    assert(ident || bases);

    if ((LY_ARRAY_COUNT(bases_p) > 1) && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                "Multiple bases in %s are allowed only in YANG 1.1 modules.", ident ? "identity" : "identityref type");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(bases_p, u) {
        s = strchr(bases_p[u], ':');
        if (s) {
            /* prefixed identity */
            name = &s[1];
            mod = ly_resolve_prefix(ctx->ctx, bases_p[u], s - bases_p[u], LY_VALUE_SCHEMA, (void *)base_pmod);
        } else {
            name = bases_p[u];
            mod = base_pmod->mod;
        }
        if (!mod) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }

        idref = NULL;
        LY_ARRAY_FOR(mod->identities, v) {
            if (!strcmp(name, mod->identities[v].name)) {
                if (ident) {
                    if (ident == &mod->identities[v]) {
                        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                                "Identity \"%s\" is derived from itself.", ident->name);
                        return LY_EVALID;
                    }
                    LY_CHECK_RET(lys_compile_identity_circular_check(ctx, &mod->identities[v], ident->derived));
                    /* we have match! store the backlink */
                    LY_ARRAY_NEW_RET(ctx->ctx, mod->identities[v].derived, idref, LY_EMEM);
                    *idref = ident;
                } else {
                    /* we have match! store the found identity */
                    LY_ARRAY_NEW_RET(ctx->ctx, *bases, idref, LY_EMEM);
                    *idref = &mod->identities[v];
                }
                break;
            }
        }
        if (!idref) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}